

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptOutputPrimitiveGeometry(HlslGrammar *this,TLayoutGeometry *geometry)

{
  EHlslTokenClass EVar1;
  uint uVar2;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar2 = EVar1 - EHTokPointStream;
  if (uVar2 < 3) {
    *geometry = uVar2 * 3 + ElgPoints;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  return uVar2 < 3;
}

Assistant:

bool HlslGrammar::acceptOutputPrimitiveGeometry(TLayoutGeometry& geometry)
{
    // read geometry type
    const EHlslTokenClass geometryType = peek();

    switch (geometryType) {
    case EHTokPointStream:    geometry = ElgPoints;        break;
    case EHTokLineStream:     geometry = ElgLineStrip;     break;
    case EHTokTriangleStream: geometry = ElgTriangleStrip; break;
    default:
        return false;  // not a layout geometry
    }

    advanceToken();  // consume the layout keyword
    return true;
}